

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::HinOutTestIO(HinOut *this,HModel *ptr)

{
  ostream *this_00;
  HinOut *in_RSI;
  HModel *in_RDI;
  int in_stack_0000012c;
  HinOut *in_stack_00000130;
  
  HinOutTestWrite(in_RSI,in_RDI);
  HinOutTestRead(in_RSI,in_RDI);
  compareData(in_stack_00000130,in_stack_0000012c);
  this_00 = std::operator<<((ostream *)&std::cout," DATA IS THE SAME");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void HinOut::HinOutTestIO(HModel & ptr) {

	HinOutTestWrite(ptr);
	//clearData();
	HinOutTestRead(ptr);

	compareData(2); cout<<" DATA IS THE SAME"<<endl;
}